

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O0

bool __thiscall DnsStats::IsNumericDomain(DnsStats *this,uint8_t *tld,uint32_t length)

{
  uint local_24;
  uint32_t i;
  bool ret;
  uint32_t length_local;
  uint8_t *tld_local;
  DnsStats *this_local;
  
  local_24 = 0;
  while( true ) {
    if (length <= local_24) {
      return true;
    }
    if ((tld[local_24] < 0x30) || (0x39 < tld[local_24])) break;
    local_24 = local_24 + 1;
  }
  return false;
}

Assistant:

bool DnsStats::IsNumericDomain(uint8_t * tld, uint32_t length)
{
    bool ret = true;

    for (uint32_t i = 0; i < length; i++)
    {
        if (tld[i] < '0' || tld[i] > '9')
        {
            ret = false;
            break;
        }
    }

    return ret;
}